

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Testing.h
# Opt level: O1

void AssertEqual<HttpResult::Code,HttpResult::Code>
               (Code *actual,Code *expected,char *fileName,int lineNumber)

{
  ostream *this;
  logic_error *this_00;
  stringstream msg;
  char *local_1d0;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  if (*expected == *actual) {
    return;
  }
  std::__cxx11::stringstream::stringstream(local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a0,"Equality assumption is broken: file \'",0x25);
  this = std::operator<<(local_1a0,fileName);
  std::__ostream_insert<char,std::char_traits<char>>(this,"\'; line ",8);
  std::ostream::operator<<((ostream *)this,lineNumber);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"; Expected: ",0xc);
  operator<<(local_1a0,*expected);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"; Actual: ",10);
  operator<<(local_1a0,*actual);
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::logic_error::logic_error(this_00,local_1d0);
  *(undefined ***)this_00 = &PTR__logic_error_00105d90;
  __cxa_throw(this_00,&AssertionException::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void AssertEqual(Actual&& actual, Expected&& expected, const char* fileName, int lineNumber)
{
    if (expected != actual)
    {
        std::stringstream msg;
        msg << "Equality assumption is broken: file '" << fileName << "'; line " << lineNumber;
        msg << "; Expected: " << expected << "; Actual: " << actual;
        throw AssertionException(msg.str().c_str());
    }
}